

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxNode *args_5;
  SyntaxList<slang::syntax::MemberSyntax> *args_7;
  ClockingDeclarationSyntax *pCVar1;
  DeepCloneVisitor visitor_1;
  Token local_90;
  Token local_80;
  Token local_70;
  Token local_60;
  Token local_50;
  DeepCloneVisitor visitor;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  local_70 = parsing::Token::deepClone((Token *)(__fn + 0x70),(BumpAllocator *)__child_stack);
  local_80 = parsing::Token::deepClone((Token *)(__fn + 0x80),(BumpAllocator *)__child_stack);
  args_5 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x90),&visitor,(BumpAllocator *)__child_stack);
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x98),(BumpAllocator *)__child_stack);
  args_7 = deepClone<slang::syntax::MemberSyntax>
                     ((SyntaxList<slang::syntax::MemberSyntax> *)(__fn + 0xa8),
                      (BumpAllocator *)__child_stack);
  local_90 = parsing::Token::deepClone((Token *)(__fn + 0xe0),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0xf0) == (SyntaxNode *)0x0) {
    _visitor_1 = (SyntaxNode *)0x0;
  }
  else {
    _visitor_1 = detail::
                 visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                           (*(SyntaxNode **)(__fn + 0xf0),&visitor_1,(BumpAllocator *)__child_stack)
    ;
  }
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ClockingDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::EventExpressionSyntax&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
                     ((BumpAllocator *)__child_stack,args,&local_50,&local_60,&local_70,&local_80,
                      (EventExpressionSyntax *)args_5,(Token *)&visitor,args_7,&local_90,
                      (NamedBlockClauseSyntax **)&visitor_1);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ClockingDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ClockingDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.globalOrDefault.deepClone(alloc),
        node.clocking.deepClone(alloc),
        node.blockName.deepClone(alloc),
        node.at.deepClone(alloc),
        *deepClone<EventExpressionSyntax>(*node.event, alloc),
        node.semi.deepClone(alloc),
        *deepClone(node.items, alloc),
        node.endClocking.deepClone(alloc),
        node.endBlockName ? deepClone(*node.endBlockName, alloc) : nullptr
    );
}